

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O1

void __thiscall Assimp::Discreet3DSImporter::ParseKeyframeChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  uint _limit;
  Chunk chunk;
  Chunk local_1e;
  
  if (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current)) {
    do {
      ReadChunk(this,&local_1e);
      if (0 < (int)(local_1e.Size - 6)) {
        this_00 = this->stream;
        _limit = StreamReader<false,_false>::SetReadLimit
                           (this_00,(local_1e.Size - 6) +
                                    (*(int *)&this_00->current - *(int *)&this_00->buffer));
        if ((ushort)(local_1e.Flag + 0x4ffe) < 6) {
          ParseHierarchyChunk(this,local_1e.Flag);
        }
        this->stream->current = this->stream->limit;
        StreamReader<false,_false>::SetReadLimit(this->stream,_limit);
        if (*(int *)&this->stream->limit == *(int *)&this->stream->current) {
          return;
        }
      }
    } while (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current));
  }
  return;
}

Assistant:

void Discreet3DSImporter::ParseKeyframeChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_TRACKCAMTGT:
    case Discreet3DS::CHUNK_TRACKSPOTL:
    case Discreet3DS::CHUNK_TRACKCAMERA:
    case Discreet3DS::CHUNK_TRACKINFO:
    case Discreet3DS::CHUNK_TRACKLIGHT:
    case Discreet3DS::CHUNK_TRACKLIGTGT:

        // this starts a new mesh hierarchy chunk
        ParseHierarchyChunk(chunk.Flag);
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}